

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O2

int msr_sys_write(raplcap_msr_sys_ctx *ctx,uint64_t msrval,uint32_t pkg,uint32_t die,off_t msr)

{
  ssize_t sVar1;
  uint uVar2;
  uint64_t msrval_local;
  
  msrval_local = msrval;
  if (ctx == (raplcap_msr_sys_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,0x138,
                  "int msr_sys_write(const raplcap_msr_sys_ctx *, uint64_t, uint32_t, uint32_t, off_t)"
                 );
  }
  if (-1 < msr) {
    uVar2 = pkg * ctx->n_die + die;
    if (uVar2 < ctx->n_fds) {
      sVar1 = pwrite(ctx->fds[uVar2],&msrval_local,8,msr);
      return -(uint)(sVar1 != 8);
    }
    __assert_fail("(pkg * ctx->n_die) + die < ctx->n_fds",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,0x13a,
                  "int msr_sys_write(const raplcap_msr_sys_ctx *, uint64_t, uint32_t, uint32_t, off_t)"
                 );
  }
  __assert_fail("msr >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                ,0x139,
                "int msr_sys_write(const raplcap_msr_sys_ctx *, uint64_t, uint32_t, uint32_t, off_t)"
               );
}

Assistant:

int msr_sys_write(const raplcap_msr_sys_ctx* ctx, uint64_t msrval, uint32_t pkg, uint32_t die, off_t msr) {
  assert(ctx);
  assert(msr >= 0);
  assert((pkg * ctx->n_die) + die < ctx->n_fds);
  raplcap_log(DEBUG, "msr_sys_write: msr=0x%lX, msrval=0x%016lX\n", msr, msrval);
  if (pwrite(ctx->fds[(pkg * ctx->n_die) + die], &msrval, sizeof(uint64_t), msr) == sizeof(uint64_t)) {
    return 0;
  }
  raplcap_log(DEBUG, "msr_sys_write(0x%lX): pwrite: %s\n", msr, strerror(errno));
  return -1;
}